

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::struct_builder::do_inherit(struct_builder *this)

{
  bool bVar1;
  size_t sVar2;
  MappedReference<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>_> puVar3;
  undefined8 uVar4;
  string *str;
  size_t it;
  type_t *t;
  var builder;
  undefined1 in_stack_000007ef;
  iterator *in_stack_000007f0;
  runtime_type *in_stack_000007f8;
  string *in_stack_fffffffffffffea8;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffeb0;
  runtime_error *this_00;
  type_info *in_stack_fffffffffffffeb8;
  type_info *in_stack_fffffffffffffec0;
  allocator *paVar5;
  key_arg<unsigned_long> *in_stack_fffffffffffffec8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffed0;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  exception in_stack_ffffffffffffff37;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [56];
  size_t local_68;
  undefined1 local_5a;
  allocator local_59;
  string local_58 [32];
  type_t *local_38;
  tree_node *local_20;
  iterator local_10 [2];
  
  local_10[0] = tree_type<cs::token_base_*>::root
                          ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffea8);
  bVar1 = tree_type<cs::token_base_*>::iterator::usable(local_10);
  if (bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5db543);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5db54f);
    local_20 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffea8);
    runtime_type::parse_expr(in_stack_000007f8,in_stack_000007f0,(bool)in_stack_000007ef);
    cs_impl::any::type((any *)in_stack_fffffffffffffeb0);
    bVar1 = std::type_info::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (!bVar1) {
      str = (string *)__cxa_allocate_exception(0x28);
      this_00 = (runtime_error *)&stack0xffffffffffffff37;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"Target is not a type.",(allocator *)this_00);
      runtime_error::runtime_error(this_00,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_38 = cs_impl::any::const_val<cs::type_t>
                         ((any *)CONCAT17(in_stack_ffffffffffffff37,
                                          CONCAT16(in_stack_ffffffffffffff36,
                                                   in_stack_ffffffffffffff30)));
    bVar1 = type_id::operator==((type_id *)in_stack_fffffffffffffeb0,
                                (type_id *)in_stack_fffffffffffffea8);
    if (bVar1) {
      local_5a = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Can not inherit itself.",&local_59);
      runtime_error::runtime_error
                ((runtime_error *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_5a = 0;
      __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if ((local_38->id).type_hash == 0) {
      local_c8[0x26] = (string)0x1;
      uVar4 = __cxa_allocate_exception(0x28);
      paVar5 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"Target is not a struct.",paVar5);
      runtime_error::runtime_error
                ((runtime_error *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_c8[0x26] = (string)0x0;
      __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_68 = (local_38->id).type_hash;
    while( true ) {
      phmap::priv::
      raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long,phmap::flat_hash_set<unsigned_long,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<unsigned_long>>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,phmap::flat_hash_set<unsigned_long,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<unsigned_long>>>>>
      ::
      operator[]<unsigned_long,phmap::priv::FlatHashMapPolicy<unsigned_long,phmap::flat_hash_set<unsigned_long,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<unsigned_long>>>>
                ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                  *)in_stack_fffffffffffffec0,(key_arg<unsigned_long> *)in_stack_fffffffffffffeb8);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
      ::insert<unsigned_long,_0,_0>
                (in_stack_fffffffffffffeb0,(unsigned_long *)in_stack_fffffffffffffea8);
      sVar2 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::count<unsigned_long>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (sVar2 == 0) break;
      puVar3 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
               ::
               operator[]<unsigned_long,phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)in_stack_fffffffffffffec0,
                          (key_arg<unsigned_long> *)in_stack_fffffffffffffeb8);
      local_68 = *puVar3;
    }
    sVar2 = (local_38->id).type_hash;
    puVar3 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
             ::operator[]<unsigned_long,phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffec0,
                        (key_arg<unsigned_long> *)in_stack_fffffffffffffeb8);
    *puVar3 = sVar2;
    cs_impl::any::~any((any *)0x5db9ba);
  }
  return;
}

Assistant:

void struct_builder::do_inherit()
	{
		if (mParent.root().usable()) {
			var builder = mContext->instance->parse_expr(mParent.root());
			if (builder.type() == typeid(type_t)) {
				const auto &t = builder.const_val<type_t>();
				if (mTypeId == t.id)
					throw runtime_error("Can not inherit itself.");
				if (t.id.type_hash) {
					for (std::size_t it = t.id.type_hash;;) {
						type_id::inherit_map[it].insert(mTypeId.type_hash);
						if (mParentMap.count(it) > 0)
							it = mParentMap[it];
						else
							break;
					}
					mParentMap[mTypeId.type_hash] = t.id.type_hash;
				}
				else
					throw runtime_error("Target is not a struct.");
			}
			else
				throw runtime_error("Target is not a type.");
		}
	}